

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

void __thiscall
sisl::cartesian_cubic<float>::cartesian_cubic(cartesian_cubic<float> *this,uint rx,uint ry,uint rz)

{
  uint rz_local;
  uint ry_local;
  uint rx_local;
  cartesian_cubic<float> *this_local;
  
  base_lattice<float>::base_lattice(&this->super_base_lattice<float>);
  (this->super_base_lattice<float>)._vptr_base_lattice = (_func_int **)&PTR_operator___00177a40;
  this->_nx = rx;
  this->_ny = ry;
  this->_nz = rz;
  array_n<float,_3,_std::allocator<float>_>::array_n
            (&this->_array,rx + 1,(ulong)(ry + 1),(ulong)(rz + 1));
  this->_sx = 1.0 / (double)rx;
  this->_sy = 1.0 / (double)ry;
  this->_sz = 1.0 / (double)rz;
  this->__zero = 0.0;
  return;
}

Assistant:

cartesian_cubic(unsigned int rx, unsigned int ry, unsigned int rz) : _array(rx+1, ry+1, rz+1), _nx(rx), _ny(ry), _nz(rz){
            // Setup basis scaling factors
            _sx = 1./double(rx);
            _sy = 1./double(ry);
            _sz = 1./double(rz);

            // A little hack to help OOB access
            __zero = 0;
        }